

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

void DrawLevelBackground(Level *lev,double *pos)

{
  double dVar1;
  int iVar2;
  
  if (lev != (Level *)0x0) {
    iVar2 = (screen_width * 0x1e0) / screen_height;
    framec = framec + 1;
    DispBox.TL.Pos[0] = (double)((float)iVar2 * -0.5) + *pos;
    dVar1 = (double)iVar2 + DispBox.TL.Pos[0];
    DispBox.BR.Pos[0]._0_4_ = SUB84(dVar1,0);
    DispBox.TL.Pos[1] = pos[1] + -240.0;
    DispBox.BR.Pos[0]._4_4_ = (int)((ulong)dVar1 >> 0x20);
    DispBox.BR.Pos[1] = pos[1] + -240.0 + 480.0;
    BeginQuadTreeDraw(lev,&lev->DisplayTree,&DispBox,framec);
    return;
  }
  return;
}

Assistant:

void DrawLevelBackground(struct Level *lev, double *pos)
{
   float w, h;
   if (!lev)
      return;
   h = 480.0;
   w = screen_width * 480 / screen_height;
   framec++;
   DispBox.TL.Pos[0] = pos[0] - w / 2;
   DispBox.TL.Pos[1] = pos[1] - h / 2;
   DispBox.BR.Pos[0] = DispBox.TL.Pos[0] + w;
   DispBox.BR.Pos[1] = DispBox.TL.Pos[1] + h;
   
   BeginQuadTreeDraw(lev, &lev->DisplayTree, &DispBox, framec);
}